

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffgidm(fitsfile *fptr,int *naxis,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2))
    goto LAB_00137223;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar1 = fptr->Fptr;
  if (pFVar1->hdutype == 0) {
    iVar2 = pFVar1->imgdim;
  }
  else {
    if (pFVar1->compressimg == 0) {
      *status = 0xe9;
      goto LAB_00137223;
    }
    iVar2 = pFVar1->zndim;
  }
  *naxis = iVar2;
LAB_00137223:
  return *status;
}

Assistant:

int ffgidm( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  *naxis  ,   /* O - image dimension (NAXIS value)           */
            int  *status)    /* IO - error status                           */
/*
  Get the dimension of the image (= NAXIS keyword for normal image, or
  ZNAXIS for a compressed image)
  These values are cached for faster access.
*/
{
    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        *naxis = (fptr->Fptr)->imgdim;
    }
    else if ((fptr->Fptr)->compressimg)
    {
        *naxis = (fptr->Fptr)->zndim;
    }
    else
    {
        *status = NOT_IMAGE;
    }

    return(*status);
}